

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rs.c
# Opt level: O3

Qiniu_Error
Qiniu_RS_BatchMove(Qiniu_Client *self,Qiniu_RS_BatchItemRet *rets,Qiniu_RS_EntryPathPair *entryPairs
                  ,Qiniu_ItemCount entryCount)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  char *s1;
  char *buf;
  char *__ptr;
  char *s2;
  size_t bodyLen;
  cJSON *pcVar5;
  Qiniu_Int64 QVar6;
  char *pcVar8;
  int *piVar9;
  long lVar10;
  ulong uVar11;
  Qiniu_Error QVar12;
  char *rsHost;
  cJSON *root;
  char *local_40;
  cJSON *local_38;
  char *pcVar7;
  
  QVar12 = _Qiniu_Region_Get_Rs_Host(self,(char *)0x0,(entryPairs->src).bucket,&local_40);
  pcVar7 = QVar12.message;
  uVar1 = QVar12.code;
  if (uVar1 == 200) {
    pcVar3 = Qiniu_String_Concat2(local_40,"/batch");
    if (entryCount < 1) {
      pcVar8 = (char *)0x0;
    }
    else {
      lVar10 = 0;
      pcVar7 = (char *)0x0;
      do {
        pcVar4 = Qiniu_String_Concat3
                           (*(char **)((long)&(entryPairs->src).bucket + lVar10),":",
                            *(char **)((long)&(entryPairs->src).key + lVar10));
        s1 = Qiniu_String_Encode(pcVar4);
        buf = Qiniu_String_Concat3
                        (*(char **)((long)&(entryPairs->dest).bucket + lVar10),":",
                         *(char **)((long)&(entryPairs->dest).key + lVar10));
        __ptr = Qiniu_String_Encode(buf);
        pcVar8 = "0";
        if (*(int *)((long)&entryPairs->force + lVar10) == 1) {
          pcVar8 = "1";
        }
        s2 = Qiniu_String_Concat(s1,"/",__ptr,"/force/",pcVar8,0);
        pcVar8 = Qiniu_String_Concat2("op=/move/",s2);
        free(pcVar4);
        free(s1);
        free(buf);
        free(__ptr);
        free(s2);
        if (pcVar7 != (char *)0x0) {
          pcVar4 = Qiniu_String_Concat3(pcVar7,"&",pcVar8);
          free(pcVar8);
          pcVar8 = pcVar4;
        }
        free(pcVar7);
        lVar10 = lVar10 + 0x28;
        pcVar7 = pcVar8;
      } while ((ulong)(uint)entryCount * 0x28 != lVar10);
    }
    bodyLen = strlen(pcVar8);
    QVar12 = Qiniu_Client_CallWithBuffer
                       (self,&local_38,pcVar3,pcVar8,bodyLen,"application/x-www-form-urlencoded");
    pcVar7 = QVar12.message;
    uVar1 = QVar12.code;
    free(pcVar3);
    free(pcVar8);
    uVar2 = cJSON_GetArraySize(local_38);
    if (0 < (int)uVar2) {
      piVar9 = &rets->code;
      uVar11 = 0;
      do {
        pcVar5 = cJSON_GetArrayItem(local_38,(int)uVar11);
        QVar6 = Qiniu_Json_GetInt64(pcVar5,"code",0);
        pcVar5 = cJSON_GetObjectItem(pcVar5,"data");
        *piVar9 = (int)QVar6;
        if ((int)QVar6 != 200) {
          pcVar3 = Qiniu_Json_GetString(pcVar5,"error",(char *)0x0);
          ((Qiniu_RS_BatchItemRet *)(piVar9 + -2))->error = pcVar3;
        }
        uVar11 = uVar11 + 1;
        piVar9 = piVar9 + 4;
      } while (uVar2 != uVar11);
    }
  }
  QVar12._4_4_ = 0;
  QVar12.code = uVar1;
  QVar12.message = pcVar7;
  return QVar12;
}

Assistant:

Qiniu_Error Qiniu_RS_BatchMove(
    Qiniu_Client *self, Qiniu_RS_BatchItemRet *rets,
    Qiniu_RS_EntryPathPair *entryPairs, Qiniu_ItemCount entryCount)
{
    int code;
    Qiniu_Error err;
    cJSON *root, *arrayItem, *dataItem;
    char *body = NULL, *bodyTmp = NULL;
    char *entryURISrc, *entryURISrcEncoded, *opBody;
    char *entryURIDest, *entryURIDestEncoded, *bodyPart;
    Qiniu_ItemCount curr = 0;
    Qiniu_ItemCount retSize = 0;
    Qiniu_RS_EntryPathPair *entryPair = entryPairs;
    const char *rsHost;

    err = _Qiniu_Region_Get_Rs_Host(self, NULL, entryPair->src.bucket, &rsHost);
    if (err.code != 200)
    {
        return err;
    }

    char *url = Qiniu_String_Concat2(rsHost, "/batch");

    curr = 0;
    while (curr < entryCount)
    {
        entryURISrc = Qiniu_String_Concat3(entryPair->src.bucket, ":", entryPair->src.key);
        entryURISrcEncoded = Qiniu_String_Encode(entryURISrc);
        entryURIDest = Qiniu_String_Concat3(entryPair->dest.bucket, ":", entryPair->dest.key);
        entryURIDestEncoded = Qiniu_String_Encode(entryURIDest);

        char *forceStr = "0";
        if (entryPair->force == Qiniu_True)
        {
            forceStr = "1";
        }

        bodyPart = Qiniu_String_Concat(entryURISrcEncoded, "/", entryURIDestEncoded, "/force/", forceStr, NULL);
        opBody = Qiniu_String_Concat2("op=/move/", bodyPart);
        free(entryURISrc);
        free(entryURISrcEncoded);
        free(entryURIDest);
        free(entryURIDestEncoded);
        free(bodyPart);

        if (!body)
        {
            bodyTmp = opBody;
        }
        else
        {
            bodyTmp = Qiniu_String_Concat3(body, "&", opBody);
            free(opBody);
        }
        free(body);
        body = bodyTmp;
        curr++;
        entryPair = &entryPairs[curr];
    }

    err = Qiniu_Client_CallWithBuffer(self, &root,
                                      url, body, strlen(body), "application/x-www-form-urlencoded");
    free(url);
    free(body);

    retSize = cJSON_GetArraySize(root);

    curr = 0;
    while (curr < retSize)
    {
        arrayItem = cJSON_GetArrayItem(root, curr);
        code = (int)Qiniu_Json_GetInt64(arrayItem, "code", 0);
        dataItem = cJSON_GetObjectItem(arrayItem, "data");

        rets[curr].code = code;

        if (code != 200)
        {
            rets[curr].error = Qiniu_Json_GetString(dataItem, "error", 0);
        }
        curr++;
    }

    return err;
}